

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

ConstTokenOrSyntax * __thiscall
slang::syntax::UdpEntrySyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,UdpEntrySyntax *this,size_t index)

{
  TokenList *pTVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  switch(index) {
  case 0:
    pTVar1 = &this->preInputs;
    goto LAB_0027908f;
  case 1:
    *(UdpEdgeIndicatorSyntax **)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         this->edgeIndicator;
    goto LAB_002790aa;
  case 2:
    pTVar1 = &this->postInputs;
LAB_0027908f:
    *(SyntaxNode **)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         &(pTVar1->super_SyntaxListBase).super_SyntaxNode;
LAB_002790aa:
    *(__index_type *)
     ((long)&(__return_storage_ptr__->
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
     + 0x10) = '\x01';
    return __return_storage_ptr__;
  case 3:
    uVar2._0_2_ = (this->colon1).kind;
    uVar2._2_1_ = (this->colon1).field_0x2;
    uVar2._3_1_ = (this->colon1).numFlags;
    uVar3 = (this->colon1).rawLen;
    uVar4 = *(undefined4 *)&(this->colon1).info;
    uVar5 = *(undefined4 *)((long)&(this->colon1).info + 4);
    break;
  case 4:
    uVar2._0_2_ = (this->current).kind;
    uVar2._2_1_ = (this->current).field_0x2;
    uVar2._3_1_ = (this->current).numFlags;
    uVar3 = (this->current).rawLen;
    uVar4 = *(undefined4 *)&(this->current).info;
    uVar5 = *(undefined4 *)((long)&(this->current).info + 4);
    break;
  case 5:
    uVar2._0_2_ = (this->colon2).kind;
    uVar2._2_1_ = (this->colon2).field_0x2;
    uVar2._3_1_ = (this->colon2).numFlags;
    uVar3 = (this->colon2).rawLen;
    uVar4 = *(undefined4 *)&(this->colon2).info;
    uVar5 = *(undefined4 *)((long)&(this->colon2).info + 4);
    break;
  case 6:
    uVar2._0_2_ = (this->next).kind;
    uVar2._2_1_ = (this->next).field_0x2;
    uVar2._3_1_ = (this->next).numFlags;
    uVar3 = (this->next).rawLen;
    uVar4 = *(undefined4 *)&(this->next).info;
    uVar5 = *(undefined4 *)((long)&(this->next).info + 4);
    break;
  case 7:
    uVar2._0_2_ = (this->semi).kind;
    uVar2._2_1_ = (this->semi).field_0x2;
    uVar2._3_1_ = (this->semi).numFlags;
    uVar3 = (this->semi).rawLen;
    uVar4 = *(undefined4 *)&(this->semi).info;
    uVar5 = *(undefined4 *)((long)&(this->semi).info + 4);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
    return __return_storage_ptr__;
  }
  *(undefined4 *)
   &(__return_storage_ptr__->super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
    ).super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = uVar2;
  *(uint32_t *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   4) = uVar3;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   8) = uVar4;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0xc) = uVar5;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = '\0';
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax UdpEntrySyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &preInputs;
        case 1: return edgeIndicator;
        case 2: return &postInputs;
        case 3: return colon1;
        case 4: return current;
        case 5: return colon2;
        case 6: return next;
        case 7: return semi;
        default: return nullptr;
    }
}